

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int main(void)

{
  Calculator *this;
  double dVar1;
  double dVar2;
  __type _Var3;
  double dVar4;
  double t2_2;
  int i_2;
  double t1_2;
  double y_2;
  double t2_1;
  int local_f4;
  double dStack_f0;
  int i_1;
  double t1_1;
  double y_1;
  undefined1 local_c8 [8];
  Calculator calc;
  double t2;
  String local_78;
  Dic<double> local_60;
  String local_58;
  int local_3c;
  double dStack_38;
  int i;
  double t1;
  double y;
  double t_native;
  double t_compute;
  double t_eval;
  int n;
  
  t_eval._4_4_ = 0;
  t_eval._0_4_ = 10000;
  t1 = 0.0;
  dStack_38 = asl::now();
  for (local_3c = 0; local_3c < 10000; local_3c = local_3c + 1) {
    asl::String::String(&local_58,"-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
    asl::String::String(&local_78,"i");
    t2 = (double)local_3c;
    asl::Dic<double>::Dic(&local_60,&local_78,&t2);
    dVar1 = Calculator::eval(&local_58,&local_60);
    t1 = dVar1 + t1;
    asl::Dic<double>::~Dic(&local_60);
    asl::String::~String(&local_78);
    asl::String::~String(&local_58);
  }
  calc._natfunctions.super_Map<asl::String,_double_(*)(double)>.a._a =
       (Map<asl::String,_double_(*)(double)>)asl::now();
  t_compute = ((double)calc._natfunctions.super_Map<asl::String,_double_(*)(double)>.a._a -
              dStack_38) / 10000.0;
  printf("Eval:    %f (%.3f us)\n",t1,t_compute * 1000000.0);
  asl::String::String((String *)&y_1,"-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
  Calculator::Calculator((Calculator *)local_c8,(String *)&y_1);
  asl::String::~String((String *)&y_1);
  t1_1 = 0.0;
  dStack_f0 = asl::now();
  for (local_f4 = 0; local_f4 < 10000; local_f4 = local_f4 + 1) {
    asl::String::String((String *)&t2_1,"i");
    this = Calculator::set((Calculator *)local_c8,(String *)&t2_1,(double)local_f4);
    dVar1 = Calculator::compute(this);
    t1_1 = dVar1 + t1_1;
    asl::String::~String((String *)&t2_1);
  }
  dVar1 = asl::now();
  t_native = (dVar1 - dStack_f0) / 10000.0;
  printf("Compute: %f (%.3f us)\n",t1_1,t_native * 1000000.0);
  Calculator::~Calculator((Calculator *)local_c8);
  t1_2 = 0.0;
  dVar1 = asl::now();
  for (t2_2._4_4_ = 0; t2_2._4_4_ < 10000; t2_2._4_4_ = t2_2._4_4_ + 1) {
    dVar2 = cos((double)t2_2._4_4_ * 5.0);
    _Var3 = std::pow<double,int>(3.141592653589793,2);
    dVar4 = sqrt((double)t2_2._4_4_ * _Var3);
    t1_2 = dVar2 * -3.5 + ((dVar4 + -2.0) * 3.141592653589793) / 3.0 + t1_2;
  }
  dVar2 = asl::now();
  y = (dVar2 - dVar1) / 10000.0;
  printf("Native:  %f (%.3f us)\n",t1_2,y * 1000000.0);
  printf("\nRelative times:\nnative: 1\ncompute: %.1f\neval: %.1f\n",t_native / y,t_compute / y);
  return t_eval._4_4_;
}

Assistant:

int main()
{
	const int n = 10000; // do computation n times

	double t_eval, t_compute, t_native;

	// using eval():
	{
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++) {
			y += Calculator::eval("-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3", Dic<double>("i", i));
		}
		double t2 = now();
		t_eval = (t2 - t1) / n;
		printf("Eval:    %f (%.3f us)\n", y, t_eval * 1e6);
	}

	// parsing once and then using compute():
	{
		Calculator calc("-3.5*cos(i*5)+pi*(-2+sqrt(i*pi^2))/3");
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++) {
			y += calc.set("i", i).compute();
		}
		double t2 = now();
		t_compute = (t2 - t1) / n;
		printf("Compute: %f (%.3f us)\n", y, t_compute * 1e6);
	}

	// now the same in native code:
	{
		double y = 0;
		double t1 = now();
		for (int i = 0; i < n; i++)
			y += -3.5*cos(i*5.0) + PI*(-2 + sqrt(i*pow(PI, 2))) / 3;
		double t2 = now();
		t_native = (t2 - t1) / n;
		printf("Native:  %f (%.3f us)\n", y, t_native * 1e6);
	}

	printf("\nRelative times:\nnative: 1\ncompute: %.1f\neval: %.1f\n", t_compute/t_native, t_eval/t_native);
}